

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindowSettings *pIVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  char *__haystack;
  ulong uVar7;
  long lVar8;
  
  if ((imgui_ctx->Windows).Size != 0) {
    uVar7 = 0;
    do {
      pIVar2 = (imgui_ctx->Windows).Data[uVar7];
      if ((pIVar2->Flags & 0x100) == 0) {
        if ((long)pIVar2->SettingsIdx == -1) {
          uVar6 = (ulong)(uint)(GImGui->SettingsWindows).Size;
          if (uVar6 != 0) {
            pIVar3 = (GImGui->SettingsWindows).Data;
            do {
              if (pIVar3->ID == pIVar2->ID) goto LAB_00128016;
              pIVar3 = pIVar3 + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          pIVar3 = (ImGuiWindowSettings *)0x0;
        }
        else {
          pIVar3 = (imgui_ctx->SettingsWindows).Data + pIVar2->SettingsIdx;
        }
LAB_00128016:
        if (pIVar3 == (ImGuiWindowSettings *)0x0) {
          pIVar3 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          pIVar2->SettingsIdx =
               (int)((ulong)((long)pIVar3 - (long)(imgui_ctx->SettingsWindows).Data) >> 5);
        }
        pIVar3->Pos = pIVar2->Pos;
        pIVar3->Size = pIVar2->SizeFull;
        pIVar3->Collapsed = pIVar2->Collapsed;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)(imgui_ctx->Windows).Size);
  }
  iVar5 = 0;
  if ((buf->Buf).Data != (char *)0x0) {
    iVar5 = (buf->Buf).Size + -1;
  }
  ImGuiTextBuffer::reserve(buf,(imgui_ctx->SettingsWindows).Size * 0x60 + iVar5);
  if ((imgui_ctx->SettingsWindows).Size != 0) {
    lVar8 = 0x1c;
    uVar7 = 0;
    do {
      pIVar3 = (imgui_ctx->SettingsWindows).Data;
      fVar1 = *(float *)((long)pIVar3 + lVar8 + -0x10);
      if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
        __haystack = *(char **)((long)pIVar3 + lVar8 + -0x1c);
        pcVar4 = strstr(__haystack,"###");
        if (pcVar4 != (char *)0x0) {
          __haystack = pcVar4;
        }
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,__haystack);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar3 + lVar8 + -0x10),
                   (ulong)(uint)(int)*(float *)((long)pIVar3 + lVar8 + -0xc));
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar3 + lVar8 + -8),
                   (ulong)(uint)(int)*(float *)((long)pIVar3 + lVar8 + -4));
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar3->Name + lVar8))
        ;
        ImGuiTextBuffer::appendf(buf,"\n");
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 != (uint)(imgui_ctx->SettingsWindows).Size);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}